

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O0

void __thiscall Sphere::Sphere(Sphere *this,Vector3f *center,float radius,Material *material)

{
  Material *material_local;
  float radius_local;
  Vector3f *center_local;
  Sphere *this_local;
  
  Object3D::Object3D(&this->super_Object3D,material);
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Sphere_00170958;
  Vector3f::Vector3f(&this->_center,center);
  this->_radius = radius;
  return;
}

Assistant:

Sphere(const Vector3f &center,
           float radius,
           Material *material) :
            Object3D(material),
            _center(center),
            _radius(radius) {
    }